

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O2

string * __thiscall
TargetPropertyNode::Evaluate
          (string *__return_storage_ptr__,TargetPropertyNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *dagCheckerParent)

{
  bool bVar1;
  Result RVar2;
  TargetType TVar3;
  int iVar4;
  PolicyStatus PVar5;
  long lVar6;
  char *pcVar7;
  cmGeneratorTarget *pcVar8;
  string *psVar9;
  ostream *poVar10;
  cmLinkInterfaceLibraries *libraries;
  cmLinkImplementationLibraries *libraries_00;
  char *pcVar11;
  cmGeneratorTarget *head;
  size_t i;
  basic_string_view<char,_std::char_traits<char>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  cmGeneratorTarget *target;
  string propertyName;
  string prop;
  string linkedTargetsContent;
  string local_238;
  string interfacePropertyName;
  string targetName;
  __shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> local_1d8;
  string local_1c8;
  cmGeneratorExpressionDAGChecker dagChecker;
  
  if ((Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
       ::propertyNameValidator == '\0') &&
     (iVar4 = __cxa_guard_acquire(&Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                                   ::propertyNameValidator), iVar4 != 0)) {
    cmsys::RegularExpression::RegularExpression(&Evaluate::propertyNameValidator,"^[A-Za-z0-9_]+$");
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&Evaluate::propertyNameValidator,
                 &__dso_handle);
    __cxa_guard_release(&Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                         ::propertyNameValidator);
  }
  target = (cmGeneratorTarget *)0x0;
  targetName._M_dataplus._M_p = (pointer)&targetName.field_2;
  targetName._M_string_length = 0;
  propertyName._M_dataplus._M_p = (pointer)&propertyName.field_2;
  propertyName._M_string_length = 0;
  targetName.field_2._M_local_buf[0] = '\0';
  propertyName.field_2._M_local_buf[0] = '\0';
  lVar6 = (long)(parameters->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(parameters->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start >> 5;
  if (lVar6 == 1) {
    target = context->HeadTarget;
    std::__cxx11::string::_M_assign((string *)&propertyName);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&context->SeenTargetProperties,&propertyName);
    context->HadHeadSensitiveCondition = true;
    if (target == (cmGeneratorTarget *)0x0) {
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)&dagChecker,content);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&prop,
                 "$<TARGET_PROPERTY:prop>  may only be used with binary targets.  It may not be used with add_custom_command or add_custom_target.  Specify the target to read a property from using the $<TARGET_PROPERTY:tgt,prop> signature instead."
                 ,(allocator<char> *)&linkedTargetsContent);
      reportError(context,(string *)&dagChecker,&prop);
    }
    else {
LAB_003103f4:
      bVar1 = std::operator==(&propertyName,"SOURCES");
      if (bVar1) {
        std::
        _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
        ::_M_insert_unique<cmGeneratorTarget_const*const&>
                  ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                    *)&context->SourceSensitiveTargets,&target);
      }
      if (propertyName._M_string_length == 0) {
        GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)&dagChecker,content);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&prop,
                   "$<TARGET_PROPERTY:...> expression requires a non-empty property name.",
                   (allocator<char> *)&linkedTargetsContent);
        reportError(context,(string *)&dagChecker,&prop);
      }
      else {
        bVar1 = cmsys::RegularExpression::find
                          (&Evaluate::propertyNameValidator,propertyName._M_dataplus._M_p);
        if (bVar1) {
          if (target == (cmGeneratorTarget *)0x0) {
            __assert_fail("target",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmGeneratorExpressionNode.cxx"
                          ,0x4a9,
                          "virtual std::string TargetPropertyNode::Evaluate(const std::vector<std::string> &, cmGeneratorExpressionContext *, const GeneratorExpressionContent *, cmGeneratorExpressionDAGChecker *) const"
                         );
          }
          bVar1 = std::operator==(&propertyName,"LINKER_LANGUAGE");
          if (!bVar1) {
            std::__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr(&local_1d8,
                         (__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                          *)context);
            pcVar8 = target;
            std::__cxx11::string::string((string *)&local_1c8,(string *)&propertyName);
            cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
                      (&dagChecker,(cmListFileBacktrace *)&local_1d8,pcVar8,&local_1c8,content,
                       dagCheckerParent);
            std::__cxx11::string::~string((string *)&local_1c8);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1d8._M_refcount)
            ;
            RVar2 = cmGeneratorExpressionDAGChecker::Check(&dagChecker);
            if (RVar2 == SELF_REFERENCE) {
              GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&prop,content);
              cmGeneratorExpressionDAGChecker::ReportError(&dagChecker,context,&prop);
              std::__cxx11::string::~string((string *)&prop);
LAB_0031092e:
              (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2
              ;
              __return_storage_ptr__->_M_string_length = 0;
              (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
            }
            else {
              if (RVar2 == CYCLIC_REFERENCE) goto LAB_0031092e;
              if (RVar2 == ALREADY_SEEN) {
                lVar6 = 1;
                do {
                  if (lVar6 == 0xb) goto LAB_00310854;
                  bVar1 = std::operator==(targetPropertyTransitiveWhitelist[lVar6],&propertyName);
                  lVar6 = lVar6 + 1;
                } while (!bVar1);
                goto LAB_0031092e;
              }
LAB_00310854:
              prop._M_dataplus._M_p = (pointer)&prop.field_2;
              prop._M_string_length = 0;
              prop.field_2._M_local_buf[0] = '\0';
              pcVar7 = cmGeneratorTarget::GetProperty(target,&propertyName);
              if (pcVar7 != (char *)0x0) {
                std::__cxx11::string::assign((char *)&prop);
              }
              if (((dagCheckerParent == (cmGeneratorExpressionDAGChecker *)0x0) ||
                  (bVar1 = cmGeneratorExpressionDAGChecker::EvaluatingGenexExpression
                                     (dagCheckerParent), bVar1)) ||
                 (bVar1 = cmGeneratorExpressionDAGChecker::EvaluatingPICExpression(dagCheckerParent)
                 , bVar1)) {
LAB_003108af:
                linkedTargetsContent._M_dataplus._M_p = (pointer)&linkedTargetsContent.field_2;
                linkedTargetsContent._M_string_length = 0;
                linkedTargetsContent.field_2._M_local_buf[0] = '\0';
                interfacePropertyName._M_dataplus._M_p = (pointer)&interfacePropertyName.field_2;
                interfacePropertyName._M_string_length = 0;
                interfacePropertyName.field_2._M_local_buf[0] = '\0';
                bVar1 = std::operator==(&propertyName,"INCLUDE_DIRECTORIES");
                if (bVar1) {
LAB_003108f0:
                  std::__cxx11::string::assign((char *)&interfacePropertyName);
                  bVar1 = false;
                }
                else {
                  bVar1 = std::operator==(&propertyName,"INTERFACE_INCLUDE_DIRECTORIES");
                  if (bVar1) {
LAB_0031095f:
                    bVar1 = true;
                    std::__cxx11::string::assign((char *)&interfacePropertyName);
                  }
                  else {
                    bVar1 = std::operator==(&propertyName,"SYSTEM_INCLUDE_DIRECTORIES");
                    if (bVar1) goto LAB_003108f0;
                    bVar1 = std::operator==(&propertyName,"INTERFACE_SYSTEM_INCLUDE_DIRECTORIES");
                    if (bVar1) goto LAB_0031095f;
                    bVar1 = std::operator==(&propertyName,"COMPILE_DEFINITIONS");
                    if (bVar1) goto LAB_003108f0;
                    bVar1 = std::operator==(&propertyName,"INTERFACE_COMPILE_DEFINITIONS");
                    if (bVar1) goto LAB_0031095f;
                    bVar1 = std::operator==(&propertyName,"COMPILE_OPTIONS");
                    if (bVar1) goto LAB_003108f0;
                    bVar1 = std::operator==(&propertyName,"INTERFACE_COMPILE_OPTIONS");
                    if (bVar1) goto LAB_0031095f;
                    bVar1 = std::operator==(&propertyName,"AUTOUIC_OPTIONS");
                    if (bVar1) goto LAB_003108f0;
                    bVar1 = std::operator==(&propertyName,"INTERFACE_AUTOUIC_OPTIONS");
                    if (bVar1) goto LAB_0031095f;
                    bVar1 = std::operator==(&propertyName,"SOURCES");
                    if (bVar1) goto LAB_003108f0;
                    bVar1 = std::operator==(&propertyName,"INTERFACE_SOURCES");
                    if (bVar1) goto LAB_0031095f;
                    bVar1 = std::operator==(&propertyName,"COMPILE_FEATURES");
                    if (bVar1) goto LAB_003108f0;
                    bVar1 = std::operator==(&propertyName,"INTERFACE_COMPILE_FEATURES");
                    if (bVar1) goto LAB_0031095f;
                    bVar1 = std::operator==(&propertyName,"LINK_OPTIONS");
                    if (bVar1) goto LAB_003108f0;
                    bVar1 = std::operator==(&propertyName,"INTERFACE_LINK_OPTIONS");
                    if (bVar1) goto LAB_0031095f;
                    bVar1 = std::operator==(&propertyName,"LINK_DIRECTORIES");
                    if (bVar1) goto LAB_003108f0;
                    bVar1 = std::operator==(&propertyName,"INTERFACE_LINK_DIRECTORIES");
                    if (bVar1) goto LAB_0031095f;
                    bVar1 = std::operator==(&propertyName,"LINK_DEPENDS");
                    if (bVar1) goto LAB_003108f0;
                    bVar1 = std::operator==(&propertyName,"INTERFACE_LINK_DEPENDS");
                    if (bVar1) goto LAB_0031095f;
                    bVar1 = cmHasLiteralPrefix<std::__cxx11::string,21ul>
                                      (&propertyName,(char (*) [21])"COMPILE_DEFINITIONS_");
                    if ((bVar1) &&
                       (PVar5 = cmLocalGenerator::GetPolicyStatus(context->LG,CMP0043), PVar5 < NEW)
                       ) {
                      std::__cxx11::string::assign((char *)&interfacePropertyName);
                    }
                    bVar1 = false;
                  }
                }
                pcVar8 = target;
                head = context->HeadTarget;
                if (context->HeadTarget == (cmGeneratorTarget *)0x0) {
                  head = target;
                }
                if (bVar1) {
                  libraries = cmGeneratorTarget::GetLinkInterfaceLibraries
                                        (target,&context->Config,head,true);
                  pcVar8 = head;
                  if (libraries != (cmLinkInterfaceLibraries *)0x0) {
                    getLinkedTargetsContent<cmLinkItem>
                              (&local_238,&libraries->Libraries,target,head,context,&dagChecker,
                               &interfacePropertyName);
LAB_00310a25:
                    std::__cxx11::string::operator=
                              ((string *)&linkedTargetsContent,(string *)&local_238);
                    std::__cxx11::string::~string((string *)&local_238);
                  }
                }
                else if ((interfacePropertyName._M_string_length != 0) &&
                        (libraries_00 = cmGeneratorTarget::GetLinkImplementationLibraries
                                                  (target,&context->Config),
                        libraries_00 != (cmLinkImplementationLibraries *)0x0)) {
                  getLinkedTargetsContent<cmLinkImplItem>
                            (&local_238,&libraries_00->Libraries,target,target,context,&dagChecker,
                             &interfacePropertyName);
                  goto LAB_00310a25;
                }
                if (pcVar7 == (char *)0x0) {
                  bVar1 = cmGeneratorTarget::IsImported(target);
                  if ((bVar1) ||
                     (TVar3 = cmGeneratorTarget::GetType(target), TVar3 == INTERFACE_LIBRARY)) {
                    (__return_storage_ptr__->_M_dataplus)._M_p =
                         (pointer)&__return_storage_ptr__->field_2;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)linkedTargetsContent._M_dataplus._M_p == &linkedTargetsContent.field_2) {
                      (__return_storage_ptr__->field_2)._M_allocated_capacity =
                           CONCAT71(linkedTargetsContent.field_2._M_allocated_capacity._1_7_,
                                    linkedTargetsContent.field_2._M_local_buf[0]);
                      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) =
                           linkedTargetsContent.field_2._8_8_;
                    }
                    else {
                      (__return_storage_ptr__->_M_dataplus)._M_p =
                           linkedTargetsContent._M_dataplus._M_p;
                      (__return_storage_ptr__->field_2)._M_allocated_capacity =
                           CONCAT71(linkedTargetsContent.field_2._M_allocated_capacity._1_7_,
                                    linkedTargetsContent.field_2._M_local_buf[0]);
                    }
                    __return_storage_ptr__->_M_string_length = linkedTargetsContent._M_string_length
                    ;
LAB_00310ea8:
                    linkedTargetsContent._M_dataplus._M_p = (pointer)&linkedTargetsContent.field_2;
                    linkedTargetsContent._M_string_length = 0;
                    linkedTargetsContent.field_2._M_local_buf[0] = '\0';
                  }
                  else {
                    psVar9 = &context->Config;
                    bVar1 = cmGeneratorTarget::IsLinkInterfaceDependentBoolProperty
                                      (target,&propertyName,psVar9);
                    if (bVar1) {
                      context->HadContextSensitiveCondition = true;
                      bVar1 = cmGeneratorTarget::GetLinkInterfaceDependentBoolProperty
                                        (target,&propertyName,psVar9);
                      pcVar7 = "0";
                      if (bVar1) {
                        pcVar7 = "1";
                      }
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)__return_storage_ptr__,pcVar7,
                                 (allocator<char> *)&local_238);
                    }
                    else {
                      bVar1 = cmGeneratorTarget::IsLinkInterfaceDependentStringProperty
                                        (target,&propertyName,psVar9);
                      if (bVar1) {
                        context->HadContextSensitiveCondition = true;
                        pcVar11 = cmGeneratorTarget::GetLinkInterfaceDependentStringProperty
                                            (target,&propertyName,psVar9);
                        pcVar7 = "";
                        if (pcVar11 != (char *)0x0) {
                          pcVar7 = pcVar11;
                        }
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)__return_storage_ptr__,pcVar7,
                                   (allocator<char> *)&local_238);
                      }
                      else {
                        bVar1 = cmGeneratorTarget::IsLinkInterfaceDependentNumberMinProperty
                                          (target,&propertyName,psVar9);
                        if (bVar1) {
                          context->HadContextSensitiveCondition = true;
                          pcVar11 = cmGeneratorTarget::GetLinkInterfaceDependentNumberMinProperty
                                              (target,&propertyName,psVar9);
                          pcVar7 = "";
                          if (pcVar11 != (char *)0x0) {
                            pcVar7 = pcVar11;
                          }
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)__return_storage_ptr__,pcVar7,
                                     (allocator<char> *)&local_238);
                        }
                        else {
                          bVar1 = cmGeneratorTarget::IsLinkInterfaceDependentNumberMaxProperty
                                            (target,&propertyName,psVar9);
                          if (!bVar1) {
                            (__return_storage_ptr__->_M_dataplus)._M_p =
                                 (pointer)&__return_storage_ptr__->field_2;
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)linkedTargetsContent._M_dataplus._M_p ==
                                &linkedTargetsContent.field_2) {
                              (__return_storage_ptr__->field_2)._M_allocated_capacity =
                                   CONCAT71(linkedTargetsContent.field_2._M_allocated_capacity._1_7_
                                            ,linkedTargetsContent.field_2._M_local_buf[0]);
                              *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) =
                                   linkedTargetsContent.field_2._8_8_;
                            }
                            else {
                              (__return_storage_ptr__->_M_dataplus)._M_p =
                                   linkedTargetsContent._M_dataplus._M_p;
                              (__return_storage_ptr__->field_2)._M_allocated_capacity =
                                   CONCAT71(linkedTargetsContent.field_2._M_allocated_capacity._1_7_
                                            ,linkedTargetsContent.field_2._M_local_buf[0]);
                            }
                            __return_storage_ptr__->_M_string_length =
                                 linkedTargetsContent._M_string_length;
                            goto LAB_00310ea8;
                          }
                          context->HadContextSensitiveCondition = true;
                          pcVar11 = cmGeneratorTarget::GetLinkInterfaceDependentNumberMaxProperty
                                              (target,&propertyName,psVar9);
                          pcVar7 = "";
                          if (pcVar11 != (char *)0x0) {
                            pcVar7 = pcVar11;
                          }
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)__return_storage_ptr__,pcVar7,
                                     (allocator<char> *)&local_238);
                        }
                      }
                    }
                  }
                }
                else {
                  bVar1 = cmGeneratorTarget::IsImported(target);
                  if ((dagCheckerParent == (cmGeneratorExpressionDAGChecker *)0x0 || bVar1) ||
                     (bVar1 = cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries
                                        (dagCheckerParent,(cmGeneratorTarget *)0x0), bVar1)) {
LAB_00310a79:
                    if (interfacePropertyName._M_string_length == 0) {
                      (__return_storage_ptr__->_M_dataplus)._M_p =
                           (pointer)&__return_storage_ptr__->field_2;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)prop._M_dataplus._M_p == &prop.field_2) {
                        (__return_storage_ptr__->field_2)._M_allocated_capacity =
                             CONCAT71(prop.field_2._M_allocated_capacity._1_7_,
                                      prop.field_2._M_local_buf[0]);
                        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) =
                             prop.field_2._8_8_;
                      }
                      else {
                        (__return_storage_ptr__->_M_dataplus)._M_p = prop._M_dataplus._M_p;
                        (__return_storage_ptr__->field_2)._M_allocated_capacity =
                             CONCAT71(prop.field_2._M_allocated_capacity._1_7_,
                                      prop.field_2._M_local_buf[0]);
                      }
                      __return_storage_ptr__->_M_string_length = prop._M_string_length;
                      prop._M_string_length = 0;
                      prop.field_2._M_local_buf[0] = '\0';
                      prop._M_dataplus._M_p = (pointer)&prop.field_2;
                    }
                    else {
                      cmGeneratorExpressionNode::EvaluateDependentExpression
                                (__return_storage_ptr__,&prop,context->LG,context,pcVar8,target,
                                 &dagChecker);
                      if (linkedTargetsContent._M_string_length != 0) {
                        pcVar7 = ";";
                        if (__return_storage_ptr__->_M_string_length == 0) {
                          pcVar7 = "";
                        }
                        std::operator+(&local_238,pcVar7,&linkedTargetsContent);
                        std::__cxx11::string::append((string *)__return_storage_ptr__);
                        std::__cxx11::string::~string((string *)&local_238);
                      }
                    }
                  }
                  else {
                    psVar9 = &context->Config;
                    bVar1 = cmGeneratorTarget::IsLinkInterfaceDependentNumberMinProperty
                                      (target,&propertyName,psVar9);
                    if (bVar1) {
                      context->HadContextSensitiveCondition = true;
                      pcVar11 = cmGeneratorTarget::GetLinkInterfaceDependentNumberMinProperty
                                          (target,&propertyName,psVar9);
                      pcVar7 = "";
                      if (pcVar11 != (char *)0x0) {
                        pcVar7 = pcVar11;
                      }
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)__return_storage_ptr__,pcVar7,
                                 (allocator<char> *)&local_238);
                    }
                    else {
                      bVar1 = cmGeneratorTarget::IsLinkInterfaceDependentNumberMaxProperty
                                        (target,&propertyName,psVar9);
                      if (!bVar1) goto LAB_00310a79;
                      context->HadContextSensitiveCondition = true;
                      pcVar11 = cmGeneratorTarget::GetLinkInterfaceDependentNumberMaxProperty
                                          (target,&propertyName,psVar9);
                      pcVar7 = "";
                      if (pcVar11 != (char *)0x0) {
                        pcVar7 = pcVar11;
                      }
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)__return_storage_ptr__,pcVar7,
                                 (allocator<char> *)&local_238);
                    }
                  }
                }
                std::__cxx11::string::~string((string *)&interfacePropertyName);
                std::__cxx11::string::~string((string *)&linkedTargetsContent);
              }
              else {
                bVar1 = cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries
                                  (dagCheckerParent,(cmGeneratorTarget *)0x0);
                if (!bVar1) {
                  bVar1 = cmGeneratorExpressionDAGChecker::EvaluatingIncludeDirectories
                                    (dagCheckerParent);
                  if ((((!bVar1) &&
                       (bVar1 = cmGeneratorExpressionDAGChecker::EvaluatingSystemIncludeDirectories
                                          (dagCheckerParent), !bVar1)) &&
                      ((bVar1 = cmGeneratorExpressionDAGChecker::EvaluatingCompileDefinitions
                                          (dagCheckerParent), !bVar1 &&
                       ((bVar1 = cmGeneratorExpressionDAGChecker::EvaluatingCompileOptions
                                           (dagCheckerParent), !bVar1 &&
                        (bVar1 = cmGeneratorExpressionDAGChecker::EvaluatingAutoUicOptions
                                           (dagCheckerParent), !bVar1)))))) &&
                     ((bVar1 = cmGeneratorExpressionDAGChecker::EvaluatingSources(dagCheckerParent),
                      !bVar1 && ((((bVar1 = cmGeneratorExpressionDAGChecker::
                                            EvaluatingCompileFeatures(dagCheckerParent), !bVar1 &&
                                   (bVar1 = cmGeneratorExpressionDAGChecker::EvaluatingLinkOptions
                                                      (dagCheckerParent), !bVar1)) &&
                                  (bVar1 = cmGeneratorExpressionDAGChecker::
                                           EvaluatingLinkDirectories(dagCheckerParent), !bVar1)) &&
                                 (bVar1 = cmGeneratorExpressionDAGChecker::EvaluatingLinkDepends
                                                    (dagCheckerParent), !bVar1)))))) {
                    __assert_fail("CM_FOR_EACH_TRANSITIVE_PROPERTY_METHOD( ASSERT_TRANSITIVE_PROPERTY_METHOD) false"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmGeneratorExpressionNode.cxx"
                                  ,0x4ee,
                                  "virtual std::string TargetPropertyNode::Evaluate(const std::vector<std::string> &, cmGeneratorExpressionContext *, const GeneratorExpressionContent *, cmGeneratorExpressionDAGChecker *) const"
                                 );
                  }
                  goto LAB_003108af;
                }
                bVar1 = std::operator==("INCLUDE_DIRECTORIES",&propertyName);
                if ((((bVar1) ||
                     (bVar1 = std::operator==("INTERFACE_INCLUDE_DIRECTORIES",&propertyName), bVar1)
                     ) || (((bVar1 = std::operator==("SYSTEM_INCLUDE_DIRECTORIES",&propertyName),
                            bVar1 || ((bVar1 = std::operator==(
                                                  "INTERFACE_SYSTEM_INCLUDE_DIRECTORIES",
                                                  &propertyName), bVar1 ||
                                      (bVar1 = std::operator==("COMPILE_DEFINITIONS",&propertyName),
                                      bVar1)))) ||
                           (bVar1 = std::operator==("INTERFACE_COMPILE_DEFINITIONS",&propertyName),
                           bVar1)))) ||
                   ((((((bVar1 = std::operator==("COMPILE_OPTIONS",&propertyName), bVar1 ||
                        (bVar1 = std::operator==("INTERFACE_COMPILE_OPTIONS",&propertyName), bVar1))
                       || (bVar1 = std::operator==("AUTOUIC_OPTIONS",&propertyName), bVar1)) ||
                      (((bVar1 = std::operator==("INTERFACE_AUTOUIC_OPTIONS",&propertyName), bVar1
                        || (bVar1 = std::operator==("SOURCES",&propertyName), bVar1)) ||
                       ((bVar1 = std::operator==("INTERFACE_SOURCES",&propertyName), bVar1 ||
                        ((bVar1 = std::operator==("COMPILE_FEATURES",&propertyName), bVar1 ||
                         (bVar1 = std::operator==("INTERFACE_COMPILE_FEATURES",&propertyName), bVar1
                         )))))))) || (bVar1 = std::operator==("LINK_OPTIONS",&propertyName), bVar1))
                    || ((((bVar1 = std::operator==("INTERFACE_LINK_OPTIONS",&propertyName), bVar1 ||
                          (bVar1 = std::operator==("LINK_DIRECTORIES",&propertyName), bVar1)) ||
                         (bVar1 = std::operator==("INTERFACE_LINK_DIRECTORIES",&propertyName), bVar1
                         )) || ((bVar1 = std::operator==("LINK_DEPENDS",&propertyName), bVar1 ||
                                (bVar1 = std::operator==("INTERFACE_LINK_DEPENDS",&propertyName),
                                bVar1)))))))) {
                  GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
                            (&linkedTargetsContent,content);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&interfacePropertyName,
                             "$<TARGET_PROPERTY:...> expression in link libraries evaluation depends on target property which is transitive over the link libraries, creating a recursion."
                             ,(allocator<char> *)&local_238);
                  reportError(context,&linkedTargetsContent,&interfacePropertyName);
                  std::__cxx11::string::~string((string *)&interfacePropertyName);
                  std::__cxx11::string::~string((string *)&linkedTargetsContent);
                }
                else if (pcVar7 != (char *)0x0) goto LAB_003108af;
                (__return_storage_ptr__->_M_dataplus)._M_p =
                     (pointer)&__return_storage_ptr__->field_2;
                __return_storage_ptr__->_M_string_length = 0;
                (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
              }
              std::__cxx11::string::~string((string *)&prop);
            }
            cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker(&dagChecker);
            goto LAB_00310671;
          }
          bVar1 = cmGeneratorTarget::LinkLanguagePropagatesToDependents(target);
          if ((!bVar1 || dagCheckerParent == (cmGeneratorExpressionDAGChecker *)0x0) ||
             ((bVar1 = cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries
                                 (dagCheckerParent,(cmGeneratorTarget *)0x0), !bVar1 &&
              (bVar1 = cmGeneratorExpressionDAGChecker::EvaluatingSources(dagCheckerParent), !bVar1)
              ))) {
            cmGeneratorTarget::GetLinkerLanguage(__return_storage_ptr__,target,&context->Config);
            goto LAB_00310671;
          }
          GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
                    ((string *)&dagChecker,content);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&prop,
                     "LINKER_LANGUAGE target property can not be used while evaluating link libraries for a static library"
                     ,(allocator<char> *)&linkedTargetsContent);
          reportError(context,(string *)&dagChecker,&prop);
        }
        else {
          GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
                    ((string *)&dagChecker,content);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&prop,"Property name not supported.",
                     (allocator<char> *)&linkedTargetsContent);
          reportError(context,(string *)&dagChecker,&prop);
        }
      }
    }
LAB_0031064a:
    std::__cxx11::string::~string((string *)&prop);
    std::__cxx11::string::~string((string *)&dagChecker);
  }
  else {
    if (lVar6 != 2) {
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)&dagChecker,content);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&prop,"$<TARGET_PROPERTY:...> expression requires one or two parameters",
                 (allocator<char> *)&linkedTargetsContent);
      reportError(context,(string *)&dagChecker,&prop);
      goto LAB_0031064a;
    }
    std::__cxx11::string::_M_assign((string *)&targetName);
    std::__cxx11::string::_M_assign((string *)&propertyName);
    pcVar7 = GetErrorText(&targetName,&propertyName);
    if (pcVar7 != (char *)0x0) {
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)&dagChecker,content);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&prop,pcVar7,(allocator<char> *)&linkedTargetsContent);
      reportError(context,(string *)&dagChecker,&prop);
      goto LAB_0031064a;
    }
    __y._M_str = "ALIASED_TARGET";
    __y._M_len = 0xe;
    __x._M_str = propertyName._M_dataplus._M_p;
    __x._M_len = propertyName._M_string_length;
    bVar1 = std::operator==(__x,__y);
    if (!bVar1) {
      target = cmLocalGenerator::FindGeneratorTargetToUse(context->LG,&targetName);
      if (target == (cmGeneratorTarget *)0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&dagChecker);
        poVar10 = std::operator<<((ostream *)&dagChecker,"Target \"");
        poVar10 = std::operator<<(poVar10,(string *)&targetName);
        std::operator<<(poVar10,"\" not found.");
        GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&prop,content);
        std::__cxx11::stringbuf::str();
        reportError(context,&prop,&linkedTargetsContent);
        std::__cxx11::string::~string((string *)&linkedTargetsContent);
        std::__cxx11::string::~string((string *)&prop);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        __return_storage_ptr__->_M_string_length = 0;
        (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dagChecker);
        goto LAB_00310671;
      }
      std::
      _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
      ::_M_insert_unique<cmGeneratorTarget_const*const&>
                ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                  *)&context->AllTargets,&target);
      goto LAB_003103f4;
    }
    bVar1 = cmMakefile::IsAlias(context->LG->Makefile,&targetName);
    if ((bVar1) &&
       (pcVar8 = cmLocalGenerator::FindGeneratorTargetToUse(context->LG,&targetName),
       pcVar8 != (cmGeneratorTarget *)0x0)) {
      psVar9 = cmGeneratorTarget::GetName_abi_cxx11_(pcVar8);
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar9);
      goto LAB_00310671;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
LAB_00310671:
  std::__cxx11::string::~string((string *)&propertyName);
  std::__cxx11::string::~string((string *)&targetName);
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(
    const std::vector<std::string>& parameters,
    cmGeneratorExpressionContext* context,
    const GeneratorExpressionContent* content,
    cmGeneratorExpressionDAGChecker* dagCheckerParent) const override
  {
    static cmsys::RegularExpression propertyNameValidator("^[A-Za-z0-9_]+$");

    cmGeneratorTarget const* target = nullptr;
    std::string targetName, propertyName;

    if (parameters.size() == 2) {
      targetName = parameters[0];
      propertyName = parameters[1];

      if (const char* e = GetErrorText(targetName, propertyName)) {
        reportError(context, content->GetOriginalExpression(), e);
        return std::string();
      }
      if (propertyName == "ALIASED_TARGET"_s) {
        if (context->LG->GetMakefile()->IsAlias(targetName)) {
          if (cmGeneratorTarget* tgt =
                context->LG->FindGeneratorTargetToUse(targetName)) {
            return tgt->GetName();
          }
        }
        return std::string();
      }
      target = context->LG->FindGeneratorTargetToUse(targetName);

      if (!target) {
        std::ostringstream e;
        e << "Target \"" << targetName << "\" not found.";
        reportError(context, content->GetOriginalExpression(), e.str());
        return std::string();
      }
      context->AllTargets.insert(target);

    } else if (parameters.size() == 1) {
      target = context->HeadTarget;
      propertyName = parameters[0];

      // Keep track of the properties seen while processing.
      // The evaluation of the LINK_LIBRARIES generator expressions
      // will check this to ensure that properties have one consistent
      // value for all evaluations.
      context->SeenTargetProperties.insert(propertyName);

      context->HadHeadSensitiveCondition = true;
      if (!target) {
        reportError(
          context, content->GetOriginalExpression(),
          "$<TARGET_PROPERTY:prop>  may only be used with binary targets.  "
          "It may not be used with add_custom_command or add_custom_target.  "
          "Specify the target to read a property from using the "
          "$<TARGET_PROPERTY:tgt,prop> signature instead.");
        return std::string();
      }
    } else {
      reportError(
        context, content->GetOriginalExpression(),
        "$<TARGET_PROPERTY:...> expression requires one or two parameters");
      return std::string();
    }

    if (propertyName == "SOURCES") {
      context->SourceSensitiveTargets.insert(target);
    }

    if (propertyName.empty()) {
      reportError(
        context, content->GetOriginalExpression(),
        "$<TARGET_PROPERTY:...> expression requires a non-empty property "
        "name.");
      return std::string();
    }

    if (!propertyNameValidator.find(propertyName)) {
      ::reportError(context, content->GetOriginalExpression(),
                    "Property name not supported.");
      return std::string();
    }

    assert(target);

    if (propertyName == "LINKER_LANGUAGE") {
      if (target->LinkLanguagePropagatesToDependents() && dagCheckerParent &&
          (dagCheckerParent->EvaluatingLinkLibraries() ||
           dagCheckerParent->EvaluatingSources())) {
        reportError(
          context, content->GetOriginalExpression(),
          "LINKER_LANGUAGE target property can not be used while evaluating "
          "link libraries for a static library");
        return std::string();
      }
      return target->GetLinkerLanguage(context->Config);
    }

    cmGeneratorExpressionDAGChecker dagChecker(
      context->Backtrace, target, propertyName, content, dagCheckerParent);

    switch (dagChecker.Check()) {
      case cmGeneratorExpressionDAGChecker::SELF_REFERENCE:
        dagChecker.ReportError(context, content->GetOriginalExpression());
        return std::string();
      case cmGeneratorExpressionDAGChecker::CYCLIC_REFERENCE:
        // No error. We just skip cyclic references.
        return std::string();
      case cmGeneratorExpressionDAGChecker::ALREADY_SEEN:
        for (size_t i = 1; i < cm::size(targetPropertyTransitiveWhitelist);
             ++i) {
          if (targetPropertyTransitiveWhitelist[i] == propertyName) {
            // No error. We're not going to find anything new here.
            return std::string();
          }
        }
      case cmGeneratorExpressionDAGChecker::DAG:
        break;
    }

    std::string prop;
    bool haveProp = false;
    if (const char* p = target->GetProperty(propertyName)) {
      prop = p;
      haveProp = true;
    }

    if (dagCheckerParent) {
      if (dagCheckerParent->EvaluatingGenexExpression() ||
          dagCheckerParent->EvaluatingPICExpression()) {
        // No check required.
      } else if (dagCheckerParent->EvaluatingLinkLibraries()) {
#define TRANSITIVE_PROPERTY_COMPARE(PROPERTY)                                 \
  (#PROPERTY == propertyName || "INTERFACE_" #PROPERTY == propertyName) ||
        if (CM_FOR_EACH_TRANSITIVE_PROPERTY_NAME(
              TRANSITIVE_PROPERTY_COMPARE) false) { // NOLINT(*)
          reportError(
            context, content->GetOriginalExpression(),
            "$<TARGET_PROPERTY:...> expression in link libraries "
            "evaluation depends on target property which is transitive "
            "over the link libraries, creating a recursion.");
          return std::string();
        }
#undef TRANSITIVE_PROPERTY_COMPARE

        if (!haveProp) {
          return std::string();
        }
      } else {
#define ASSERT_TRANSITIVE_PROPERTY_METHOD(METHOD) dagCheckerParent->METHOD() ||

        assert(CM_FOR_EACH_TRANSITIVE_PROPERTY_METHOD(
          ASSERT_TRANSITIVE_PROPERTY_METHOD) false); // NOLINT(clang-tidy)
#undef ASSERT_TRANSITIVE_PROPERTY_METHOD
      }
    }

    std::string linkedTargetsContent;

    std::string interfacePropertyName;
    bool isInterfaceProperty = false;

#define POPULATE_INTERFACE_PROPERTY_NAME(prop)                                \
  if (propertyName == #prop) {                                                \
    interfacePropertyName = "INTERFACE_" #prop;                               \
  } else if (propertyName == "INTERFACE_" #prop) {                            \
    interfacePropertyName = "INTERFACE_" #prop;                               \
    isInterfaceProperty = true;                                               \
  } else

    CM_FOR_EACH_TRANSITIVE_PROPERTY_NAME(POPULATE_INTERFACE_PROPERTY_NAME)
    // Note that the above macro terminates with an else
    /* else */ if (cmHasLiteralPrefix(propertyName, "COMPILE_DEFINITIONS_")) {
      cmPolicies::PolicyStatus polSt =
        context->LG->GetPolicyStatus(cmPolicies::CMP0043);
      if (polSt == cmPolicies::WARN || polSt == cmPolicies::OLD) {
        interfacePropertyName = "INTERFACE_COMPILE_DEFINITIONS";
      }
    }
#undef POPULATE_INTERFACE_PROPERTY_NAME
    cmGeneratorTarget const* headTarget =
      context->HeadTarget && isInterfaceProperty ? context->HeadTarget
                                                 : target;

    if (isInterfaceProperty) {
      if (cmLinkInterfaceLibraries const* iface =
            target->GetLinkInterfaceLibraries(context->Config, headTarget,
                                              true)) {
        linkedTargetsContent =
          getLinkedTargetsContent(iface->Libraries, target, headTarget,
                                  context, &dagChecker, interfacePropertyName);
      }
    } else if (!interfacePropertyName.empty()) {
      if (cmLinkImplementationLibraries const* impl =
            target->GetLinkImplementationLibraries(context->Config)) {
        linkedTargetsContent =
          getLinkedTargetsContent(impl->Libraries, target, target, context,
                                  &dagChecker, interfacePropertyName);
      }
    }

    if (!haveProp) {
      if (target->IsImported() ||
          target->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
        return linkedTargetsContent;
      }
      if (target->IsLinkInterfaceDependentBoolProperty(propertyName,
                                                       context->Config)) {
        context->HadContextSensitiveCondition = true;
        return target->GetLinkInterfaceDependentBoolProperty(propertyName,
                                                             context->Config)
          ? "1"
          : "0";
      }
      if (target->IsLinkInterfaceDependentStringProperty(propertyName,
                                                         context->Config)) {
        context->HadContextSensitiveCondition = true;
        const char* propContent =
          target->GetLinkInterfaceDependentStringProperty(propertyName,
                                                          context->Config);
        return propContent ? propContent : "";
      }
      if (target->IsLinkInterfaceDependentNumberMinProperty(propertyName,
                                                            context->Config)) {
        context->HadContextSensitiveCondition = true;
        const char* propContent =
          target->GetLinkInterfaceDependentNumberMinProperty(propertyName,
                                                             context->Config);
        return propContent ? propContent : "";
      }
      if (target->IsLinkInterfaceDependentNumberMaxProperty(propertyName,
                                                            context->Config)) {
        context->HadContextSensitiveCondition = true;
        const char* propContent =
          target->GetLinkInterfaceDependentNumberMaxProperty(propertyName,
                                                             context->Config);
        return propContent ? propContent : "";
      }

      return linkedTargetsContent;
    }

    if (!target->IsImported() && dagCheckerParent &&
        !dagCheckerParent->EvaluatingLinkLibraries()) {
      if (target->IsLinkInterfaceDependentNumberMinProperty(propertyName,
                                                            context->Config)) {
        context->HadContextSensitiveCondition = true;
        const char* propContent =
          target->GetLinkInterfaceDependentNumberMinProperty(propertyName,
                                                             context->Config);
        return propContent ? propContent : "";
      }
      if (target->IsLinkInterfaceDependentNumberMaxProperty(propertyName,
                                                            context->Config)) {
        context->HadContextSensitiveCondition = true;
        const char* propContent =
          target->GetLinkInterfaceDependentNumberMaxProperty(propertyName,
                                                             context->Config);
        return propContent ? propContent : "";
      }
    }
    if (!interfacePropertyName.empty()) {
      std::string result = this->EvaluateDependentExpression(
        prop, context->LG, context, headTarget, target, &dagChecker);
      if (!linkedTargetsContent.empty()) {
        result += (result.empty() ? "" : ";") + linkedTargetsContent;
      }
      return result;
    }
    return prop;
  }